

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O2

void pybind11::detail::clean_type_id(string *name)

{
  unique_ptr<char,_void_(*)(void_*)> res;
  int status;
  allocator<char> local_49;
  unique_ptr<char,_void_(*)(void_*)> local_48;
  int local_34;
  string local_30;
  
  local_34 = 0;
  local_48._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>._M_head_impl
       = (char *)__cxa_demangle((name->_M_dataplus)._M_p,0,0,&local_34);
  local_48._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)free;
  if (local_34 == 0) {
    std::__cxx11::string::assign((char *)name);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"pybind11::",&local_49);
  erase_all(name,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&local_48);
  return;
}

Assistant:

PYBIND11_NOINLINE void clean_type_id(std::string &name) {
#if defined(__GNUG__)
    int status = 0;
    std::unique_ptr<char, void (*)(void *)> res {
        abi::__cxa_demangle(name.c_str(), nullptr, nullptr, &status), std::free };
    if (status == 0)
        name = res.get();
#else
    detail::erase_all(name, "class ");
    detail::erase_all(name, "struct ");
    detail::erase_all(name, "enum ");
#endif
    detail::erase_all(name, "pybind11::");
}